

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong __thiscall mkvparser::EBMLHeader::Parse(EBMLHeader *this,IMkvReader *pReader,longlong *pos)

{
  EBMLHeader *pEVar1;
  int iVar2;
  longlong lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uchar scan_byte;
  EBMLHeader *local_60;
  long len;
  longlong available;
  longlong total;
  longlong size;
  longlong id;
  
  if (pReader == (IMkvReader *)0x0) {
    lVar4 = -2;
  }
  else {
    iVar2 = (*pReader->_vptr_IMkvReader[1])(pReader,&total,&available);
    if (iVar2 < 0) {
LAB_0014f766:
      lVar4 = (long)iVar2;
    }
    else {
      *pos = 0;
      lVar4 = 0x400;
      if (available < 0x400) {
        lVar4 = available;
      }
      scan_byte = '\0';
      lVar5 = 0;
      local_60 = this;
      while (lVar5 < lVar4) {
        iVar2 = (**pReader->_vptr_IMkvReader)(pReader,lVar5,1,&scan_byte);
        if (iVar2 < 0) goto LAB_0014f766;
        if (iVar2 != 0) {
          return -3;
        }
        lVar5 = *pos;
        if (scan_byte == '\x1a') break;
        lVar5 = lVar5 + 1;
        *pos = lVar5;
      }
      len = 0;
      lVar3 = ReadID(pReader,lVar5,&len);
      lVar4 = -3;
      if (((lVar3 != -3) && (lVar5 = -2, lVar4 = lVar5, lVar3 == 0x1a45dfa3)) && (len == 4)) {
        lVar6 = *pos;
        *pos = lVar6 + 4;
        lVar3 = GetUIntLength(pReader,lVar6 + 4,&len);
        if (((-1 < lVar3) && (lVar4 = -3, lVar3 == 0)) &&
           ((lVar4 = lVar5, 0xfffffffffffffff7 < len - 9U &&
            (lVar6 = *pos, total < 0 || len <= total - lVar6)))) {
          if (available - lVar6 < len) {
            lVar4 = lVar6 + len;
          }
          else {
            lVar3 = ReadUInt(pReader,lVar6,&len);
            pEVar1 = local_60;
            lVar4 = lVar3;
            if (-1 < lVar3) {
              lVar6 = *pos + len;
              *pos = lVar6;
              lVar4 = lVar5;
              if ((total < 0 || lVar3 <= total - lVar6) &&
                 (lVar5 = lVar6 + lVar3, lVar4 = lVar5, lVar3 <= available - lVar6)) {
                Init(local_60);
                lVar3 = *pos;
                while (lVar3 < lVar5) {
                  lVar4 = ParseElementHeader(pReader,pos,lVar5,&id,&size);
                  lVar3 = size;
                  if (lVar4 < 0) {
                    return lVar4;
                  }
                  if (size == 0) {
                    return -2;
                  }
                  switch(id) {
                  case 0x4282:
                    if (pEVar1->m_docType != (char *)0x0) {
                      return -2;
                    }
                    lVar4 = UnserializeString(pReader,*pos,size,&pEVar1->m_docType);
                    if (lVar4 != 0) {
                      return lVar4;
                    }
                  case 0x4283:
                  case 0x4284:
                    goto switchD_0014f8cc_caseD_4283;
                  case 0x4285:
                    lVar4 = UnserializeUInt(pReader,*pos,size);
                    local_60->m_docTypeReadVersion = lVar4;
                    break;
                  case 0x4286:
                    lVar4 = UnserializeUInt(pReader,*pos,size);
                    local_60->m_version = lVar4;
                    break;
                  case 0x4287:
                    lVar4 = UnserializeUInt(pReader,*pos,size);
                    local_60->m_docTypeVersion = lVar4;
                    break;
                  default:
                    if (id == 0x42f2) {
                      lVar4 = UnserializeUInt(pReader,*pos,size);
                      local_60->m_maxIdLength = lVar4;
                    }
                    else if (id == 0x42f3) {
                      lVar4 = UnserializeUInt(pReader,*pos,size);
                      local_60->m_maxSizeLength = lVar4;
                    }
                    else {
                      if (id != 0x42f7) goto switchD_0014f8cc_caseD_4283;
                      lVar4 = UnserializeUInt(pReader,*pos,size);
                      local_60->m_readVersion = lVar4;
                    }
                  }
                  if (lVar4 < 1) {
                    return -2;
                  }
switchD_0014f8cc_caseD_4283:
                  lVar3 = lVar3 + *pos;
                  *pos = lVar3;
                }
                lVar4 = -2;
                if ((((lVar3 == lVar5) && (local_60->m_docType != (char *)0x0)) &&
                    (0 < local_60->m_docTypeReadVersion)) &&
                   ((0 < local_60->m_docTypeVersion &&
                    (0xfffffffffffffffb < local_60->m_maxIdLength - 5U)))) {
                  lVar4 = (ulong)(0xfffffffffffffff7 < local_60->m_maxSizeLength - 9U) * 2 + -2;
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar4;
}

Assistant:

long long EBMLHeader::Parse(IMkvReader* pReader, long long& pos) {
  if (!pReader)
    return E_FILE_FORMAT_INVALID;

  long long total, available;

  long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  pos = 0;

  // Scan until we find what looks like the first byte of the EBML header.
  const long long kMaxScanBytes = (available >= 1024) ? 1024 : available;
  const unsigned char kEbmlByte0 = 0x1A;
  unsigned char scan_byte = 0;

  while (pos < kMaxScanBytes) {
    status = pReader->Read(pos, 1, &scan_byte);

    if (status < 0)  // error
      return status;
    else if (status > 0)
      return E_BUFFER_NOT_FULL;

    if (scan_byte == kEbmlByte0)
      break;

    ++pos;
  }

  long len = 0;
  const long long ebml_id = ReadID(pReader, pos, len);

  if (ebml_id == E_BUFFER_NOT_FULL)
    return E_BUFFER_NOT_FULL;

  if (len != 4 || ebml_id != libwebm::kMkvEBML)
    return E_FILE_FORMAT_INVALID;

  // Move read pos forward to the EBML header size field.
  pos += 4;

  // Read length of size field.
  long long result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error
    return E_FILE_FORMAT_INVALID;
  else if (result > 0)  // need more data
    return E_BUFFER_NOT_FULL;

  if (len < 1 || len > 8)
    return E_FILE_FORMAT_INVALID;

  if ((total >= 0) && ((total - pos) < len))
    return E_FILE_FORMAT_INVALID;

  if ((available - pos) < len)
    return pos + len;  // try again later

  // Read the EBML header size.
  result = ReadUInt(pReader, pos, len);

  if (result < 0)  // error
    return result;

  pos += len;  // consume size field

  // pos now designates start of payload

  if ((total >= 0) && ((total - pos) < result))
    return E_FILE_FORMAT_INVALID;

  if ((available - pos) < result)
    return pos + result;

  const long long end = pos + result;

  Init();

  while (pos < end) {
    long long id, size;

    status = ParseElementHeader(pReader, pos, end, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvEBMLVersion) {
      m_version = UnserializeUInt(pReader, pos, size);

      if (m_version <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLReadVersion) {
      m_readVersion = UnserializeUInt(pReader, pos, size);

      if (m_readVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLMaxIDLength) {
      m_maxIdLength = UnserializeUInt(pReader, pos, size);

      if (m_maxIdLength <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLMaxSizeLength) {
      m_maxSizeLength = UnserializeUInt(pReader, pos, size);

      if (m_maxSizeLength <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDocType) {
      if (m_docType)
        return E_FILE_FORMAT_INVALID;

      status = UnserializeString(pReader, pos, size, m_docType);

      if (status)  // error
        return status;
    } else if (id == libwebm::kMkvDocTypeVersion) {
      m_docTypeVersion = UnserializeUInt(pReader, pos, size);

      if (m_docTypeVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDocTypeReadVersion) {
      m_docTypeReadVersion = UnserializeUInt(pReader, pos, size);

      if (m_docTypeReadVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;
  }

  if (pos != end)
    return E_FILE_FORMAT_INVALID;

  // Make sure DocType, DocTypeReadVersion, and DocTypeVersion are valid.
  if (m_docType == NULL || m_docTypeReadVersion <= 0 || m_docTypeVersion <= 0)
    return E_FILE_FORMAT_INVALID;

  // Make sure EBMLMaxIDLength and EBMLMaxSizeLength are valid.
  if (m_maxIdLength <= 0 || m_maxIdLength > 4 || m_maxSizeLength <= 0 ||
      m_maxSizeLength > 8)
    return E_FILE_FORMAT_INVALID;

  return 0;
}